

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error
SW_FT_Stroker_GetBorderCounts
          (SW_FT_Stroker stroker,SW_FT_StrokerBorder border,SW_FT_UInt *anum_points,
          SW_FT_UInt *anum_contours)

{
  SW_FT_UInt *in_RCX;
  SW_FT_UInt *in_RDX;
  int in_ESI;
  long in_RDI;
  SW_FT_Error error;
  SW_FT_UInt num_contours;
  SW_FT_UInt num_points;
  SW_FT_Error local_2c;
  SW_FT_UInt local_28;
  SW_FT_UInt local_24;
  SW_FT_UInt *local_20;
  SW_FT_UInt *local_18;
  
  local_24 = 0;
  local_28 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  if ((in_RDI == 0) || (1 < in_ESI)) {
    local_2c = -1;
  }
  else {
    local_2c = ft_stroke_border_get_counts
                         ((SW_FT_StrokeBorder)(in_RDI + 0x70 + (long)in_ESI * 0x28),&local_24,
                          &local_28);
  }
  if (local_18 != (SW_FT_UInt *)0x0) {
    *local_18 = local_24;
  }
  if (local_20 != (SW_FT_UInt *)0x0) {
    *local_20 = local_28;
  }
  return local_2c;
}

Assistant:

SW_FT_Error SW_FT_Stroker_GetBorderCounts(SW_FT_Stroker       stroker,
                                          SW_FT_StrokerBorder border,
                                          SW_FT_UInt*         anum_points,
                                          SW_FT_UInt*         anum_contours)
{
    SW_FT_UInt  num_points = 0, num_contours = 0;
    SW_FT_Error error;

    if (!stroker || border > 1) {
        error = -1;  // SW_FT_THROW( Invalid_Argument );
        goto Exit;
    }

    error = ft_stroke_border_get_counts(stroker->borders + border, &num_points,
                                        &num_contours);
Exit:
    if (anum_points) *anum_points = num_points;

    if (anum_contours) *anum_contours = num_contours;

    return error;
}